

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

vm_obj_id_t __thiscall CTPNConst::gen_code_obj_predot(CTPNConst *this,int *is_self)

{
  tc_constval_type_t tVar1;
  ulong uVar2;
  undefined4 *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  *in_RSI = 0;
  tVar1 = CTcConstVal::get_type((CTcConstVal *)(in_RDI + 8));
  if (tVar1 == TC_CVT_OBJ) {
    uVar2 = CTcConstVal::get_val_obj((CTcConstVal *)(in_RDI + 8));
    local_4 = (vm_obj_id_t)uVar2;
  }
  else {
    CTcTokenizer::log_error(0x2cff);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

vm_obj_id_t CTPNConst::gen_code_obj_predot(int *is_self)
{
    /* we're certainly not "self" */
    *is_self = FALSE;

    /* if I don't have an object value, this is illegal */
    if (val_.get_type() != TC_CVT_OBJ)
    {
        G_tok->log_error(TCERR_INVAL_OBJ_EXPR);
        return VM_INVALID_OBJ;
    }

    /* report our constant object value */
    return val_.get_val_obj();
}